

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.h
# Opt level: O3

void __thiscall
basist::basisu_lowlevel_etc1s_transcoder::clear(basisu_lowlevel_etc1s_transcoder *this)

{
  endpoint *__ptr;
  selector *__ptr_00;
  
  __ptr = (this->m_local_endpoints).m_p;
  if (__ptr != (endpoint *)0x0) {
    free(__ptr);
    (this->m_local_endpoints).m_p = (endpoint *)0x0;
    (this->m_local_endpoints).m_size = 0;
    (this->m_local_endpoints).m_capacity = 0;
  }
  __ptr_00 = (this->m_local_selectors).m_p;
  if (__ptr_00 != (selector *)0x0) {
    free(__ptr_00);
    (this->m_local_selectors).m_p = (selector *)0x0;
    (this->m_local_selectors).m_size = 0;
    (this->m_local_selectors).m_capacity = 0;
  }
  huffman_decoding_table::clear(&this->m_endpoint_pred_model);
  huffman_decoding_table::clear(&this->m_delta_endpoint_model);
  huffman_decoding_table::clear(&this->m_selector_model);
  huffman_decoding_table::clear(&this->m_selector_history_buf_rle_model);
  this->m_selector_history_buf_size = 0;
  return;
}

Assistant:

void clear()
		{
			m_local_endpoints.clear();
			m_local_selectors.clear();
			m_endpoint_pred_model.clear();
			m_delta_endpoint_model.clear();
			m_selector_model.clear();
			m_selector_history_buf_rle_model.clear();
			m_selector_history_buf_size = 0;
		}